

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogPipe.cpp
# Opt level: O1

void __thiscall liblogger::LogPipe::LogPipe(LogPipe *this,string *command)

{
  pointer pcVar1;
  FILE *pFVar2;
  ostream *poVar3;
  LogException *this_00;
  stringstream ss;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  (this->super_ILogger)._vptr_ILogger = (_func_int **)&PTR__LogPipe_001466d0;
  (this->m_command)._M_dataplus._M_p = (pointer)&(this->m_command).field_2;
  pcVar1 = (command->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_command,pcVar1,pcVar1 + command->_M_string_length);
  pFVar2 = popen((this->m_command)._M_dataplus._M_p,"w");
  this->m_fp = (FILE *)pFVar2;
  if (pFVar2 != (FILE *)0x0) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"failed to open pipe \'",0x15);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,(this->m_command)._M_dataplus._M_p,
                      (this->m_command)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
  this_00 = (LogException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  LogException::LogException(this_00,&local_1d0);
  __cxa_throw(this_00,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

LogPipe::LogPipe(const std::string &command) :
	m_command(command)
{
	m_fp = popen(m_command.c_str(), "w");
	if (!m_fp)
	{
		std::stringstream ss;
		ss << "failed to open pipe '" << m_command << "'";
		throw(LogException(ss.str()));
	}
}